

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderMD.cpp
# Opt level: O2

BYTE __thiscall EncoderMD::EmitModRM(EncoderMD *this,Instr *instr,Opnd *opnd,BYTE reg1)

{
  byte bVar1;
  RegOpnd *regOpnd;
  byte *pbVar2;
  BYTE *pBVar3;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  BYTE BVar10;
  undefined4 *puVar11;
  SymOpnd *pSVar12;
  IndirOpnd *indirOpnd;
  RegOpnd *pRVar13;
  MemRefOpnd *pMVar14;
  StackSym *pSVar15;
  char *message;
  int opSize;
  char *error;
  uint lineNumber;
  EncoderMD *pEVar16;
  byte bVar17;
  RegNum local_35;
  int local_34;
  RegNum rmReg;
  int dispSize;
  
  local_34 = -1;
  if (7 < reg1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                       ,0x13c,"((reg1 & 7) == reg1)","Invalid reg1");
    if (!bVar5) goto LAB_005c6217;
    *puVar11 = 0;
  }
  OVar6 = IR::Opnd::GetKind(opnd);
  if (OVar6 - 7 < 6) {
    bVar17 = reg1 << 3 & 0x38;
    switch((uint)OVar6) {
    case 7:
      pSVar12 = IR::Opnd::AsSymOpnd(opnd);
      if (pSVar12->m_sym->m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                           ,0x154,"(opnd->AsSymOpnd()->m_sym->IsStackSym())",
                           "Should only see stackSym syms in encoder.");
        if (!bVar5) goto LAB_005c6217;
        *puVar11 = 0;
      }
      pSVar12 = IR::Opnd::AsSymOpnd(opnd);
      pEVar16 = this;
      bVar9 = GetMod(this,pSVar12,&local_34,&local_35);
      bVar7 = GetRegEncode(pEVar16,local_35);
      pbVar2 = this->m_pc;
      this->m_pc = pbVar2 + 1;
      *pbVar2 = bVar9 | bVar17 | bVar7;
      if (local_35 != RegRSP) {
        pSVar12 = IR::Opnd::AsSymOpnd(opnd);
        pSVar15 = Sym::AsStackSym(pSVar12->m_sym);
        if (pSVar15->m_offset != 0) goto LAB_005c5f28;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        error = "(opnd->AsSymOpnd()->m_sym->AsStackSym()->m_offset)";
        message = "Expected stackSym offset to be set.";
        lineNumber = 0x164;
        goto LAB_005c5ea1;
      }
      pBVar3 = this->m_pc;
      this->m_pc = pBVar3 + 1;
      *pBVar3 = (bVar7 & 7) * '\t';
      goto LAB_005c5f28;
    case 8:
      pRVar13 = IR::Opnd::AsRegOpnd(opnd);
      if (pRVar13->m_reg == RegNOREG) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                           ,0x145,"(regOpnd->GetReg() != RegNOREG)",
                           "All regOpnd should have a valid reg set during encoder");
        if (!bVar5) goto LAB_005c6217;
        *puVar11 = 0;
      }
      bVar17 = GetRegEncode(this,pRVar13);
      *this->m_pc = reg1 << 3 | bVar17 | 0xc0;
      this->m_pc = this->m_pc + 1;
      return (byte)(((byte)(pRVar13->m_reg - RegXMM0) < 0x10) << 4 | RegArg0) < pRVar13->m_reg;
    default:
      break;
    case 10:
      indirOpnd = IR::Opnd::AsIndirOpnd(opnd);
      pRVar13 = indirOpnd->m_baseOpnd;
      regOpnd = indirOpnd->m_indexOpnd;
      pEVar16 = this;
      if (regOpnd == (RegOpnd *)0x0) {
        if (pRVar13 != (RegOpnd *)0x0) goto LAB_005c5f39;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                           ,0x172,"(indexOpnd != nullptr)","indexOpnd != nullptr");
        if (!bVar5) goto LAB_005c6217;
        *puVar11 = 0;
LAB_005c60d0:
        bVar9 = GetRegEncode(this,regOpnd);
        local_34 = 4;
        pbVar2 = this->m_pc;
        this->m_pc = pbVar2 + 1;
        *pbVar2 = bVar17 | 4;
        bVar1 = indirOpnd->m_scale;
        pbVar2 = this->m_pc;
        this->m_pc = pbVar2 + 1;
        *pbVar2 = (bVar9 & 7) << 3 | bVar1 << 6 | 5;
        BVar10 = '\x02';
        pRVar13 = regOpnd;
LAB_005c6142:
        bVar17 = GetRexByte(pEVar16,BVar10,&pRVar13->super_Opnd);
      }
      else {
        if (regOpnd->m_reg == RegRSP) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                             ,0x16f,"(!indexOpnd || indexOpnd->GetReg() != RegRSP)",
                             "ESP cannot be the index of an indir.");
          if (!bVar5) goto LAB_005c6217;
          *puVar11 = 0;
        }
        if (pRVar13 == (RegOpnd *)0x0) goto LAB_005c60d0;
LAB_005c5f39:
        bVar9 = GetRegEncode(this,pRVar13);
        if (regOpnd == (RegOpnd *)0x0) {
          if ((pRVar13->m_reg | RegArg0) == RegR12) {
            bVar7 = GetMod(this,indirOpnd,&local_34);
            pbVar2 = this->m_pc;
            this->m_pc = pbVar2 + 1;
            *pbVar2 = bVar17 | bVar7 | bVar9;
            pBVar3 = this->m_pc;
            this->m_pc = pBVar3 + 1;
            *pBVar3 = (bVar9 & 7) * '\t';
          }
          else {
            bVar7 = GetMod(this,indirOpnd,&local_34);
            pbVar2 = this->m_pc;
            this->m_pc = pbVar2 + 1;
            *pbVar2 = bVar17 | bVar7 | bVar9;
          }
          BVar10 = '\x01';
          goto LAB_005c6142;
        }
        bVar7 = GetRegEncode(this,regOpnd);
        bVar8 = GetMod(this,indirOpnd,&local_34);
        pbVar2 = this->m_pc;
        this->m_pc = pbVar2 + 1;
        *pbVar2 = bVar17 | bVar8 | 4;
        bVar1 = indirOpnd->m_scale;
        pbVar2 = this->m_pc;
        this->m_pc = pbVar2 + 1;
        *pbVar2 = bVar9 & 7 | (bVar7 & 7) << 3 | bVar1 << 6;
        bVar9 = GetRexByte(pEVar16,'\x02',&regOpnd->super_Opnd);
        bVar17 = GetRexByte(pEVar16,'\x01',&pRVar13->super_Opnd);
        bVar17 = bVar17 | bVar9;
      }
      goto LAB_005c614a;
    case 0xc:
      goto switchD_005c5c27_caseD_c;
    }
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar11 = 1;
  error = "((0))";
  message = "Unexpected operand kind";
  lineNumber = 0x1a1;
LAB_005c5ea1:
  bVar5 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                     ,lineNumber,error,message);
  if (!bVar5) goto LAB_005c6217;
  *puVar11 = 0;
LAB_005c5f28:
  bVar17 = 0;
LAB_005c614a:
  opSize = local_34;
  if (local_34 == -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                       ,0x1a5,"(dispSize != -1)","Uninitialized dispSize");
    if (!bVar5) goto LAB_005c6217;
    opSize = -1;
LAB_005c619f:
    *puVar11 = 0;
  }
  goto LAB_005c61a4;
switchD_005c5c27_caseD_c:
  pbVar2 = this->m_pc;
  this->m_pc = pbVar2 + 1;
  *pbVar2 = bVar17 | 4;
  pBVar3 = this->m_pc;
  this->m_pc = pBVar3 + 1;
  *pBVar3 = '%';
  pMVar14 = IR::Opnd::AsMemRefOpnd(opnd);
  if ((long)(int)pMVar14->m_memLoc != pMVar14->m_memLoc) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                       ,0x19c,"(Math::FitsInDWord((size_t)opnd->AsMemRefOpnd()->GetMemLoc()))",
                       "Size overflow");
    if (!bVar5) goto LAB_005c6217;
    opSize = 4;
    bVar17 = 0;
    goto LAB_005c619f;
  }
  opSize = 4;
  bVar17 = 0;
LAB_005c61a4:
  BVar10 = EmitImmed(this,opnd,opSize,0,false);
  if (BVar10 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                       ,0x1a9,"(retval == 0)","Not possible.");
    if (!bVar5) {
LAB_005c6217:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar11 = 0;
  }
  return bVar17;
}

Assistant:

BYTE
EncoderMD::EmitModRM(IR::Instr * instr, IR::Opnd *opnd, BYTE reg1)
{
    int dispSize = -1; // Initialize to suppress C4701 false positive
    IR::IndirOpnd *indirOpnd;
    IR::RegOpnd *regOpnd;
    IR::RegOpnd *baseOpnd;
    IR::RegOpnd *indexOpnd;
    BYTE reg;
    BYTE regBase;
    BYTE regIndex;
    BYTE baseRegEncode;
    BYTE rexEncoding = 0;

    AssertMsg( (reg1 & 7) == reg1, "Invalid reg1");

    reg1 = (reg1 & 7) << 3;       // mask and put in reg field

    switch (opnd->GetKind())
    {
    case IR::OpndKindReg:
        regOpnd = opnd->AsRegOpnd();

        AssertMsg(regOpnd->GetReg() != RegNOREG, "All regOpnd should have a valid reg set during encoder");

        reg = this->GetRegEncode(regOpnd);
        this->EmitConst((Mod11 | reg1 | reg), 1);

        if (this->IsExtendedRegister(regOpnd->GetReg()))
        {
            return REXB;
        }
        else
        {
            return 0;
        }

    case IR::OpndKindSym:
        AssertMsg(opnd->AsSymOpnd()->m_sym->IsStackSym(), "Should only see stackSym syms in encoder.");

        BYTE byte;
        RegNum rmReg;
        BYTE mod;
        mod = this->GetMod(opnd->AsSymOpnd(), &dispSize, rmReg);
        baseRegEncode = this->GetRegEncode(rmReg);
        byte = (BYTE)(mod | reg1 | baseRegEncode);
        *(m_pc++) = byte;
        if (rmReg == RegRSP)
        {
            byte = (BYTE)(((baseRegEncode & 7) << 3) | (baseRegEncode & 7));
            *(m_pc++) = byte;
        }
        else
        {
            AssertMsg(opnd->AsSymOpnd()->m_sym->AsStackSym()->m_offset, "Expected stackSym offset to be set.");
        }
        break;

    case IR::OpndKindIndir:

        indirOpnd = opnd->AsIndirOpnd();

        baseOpnd = indirOpnd->GetBaseOpnd();
        indexOpnd = indirOpnd->GetIndexOpnd();

        AssertMsg(!indexOpnd || indexOpnd->GetReg() != RegRSP, "ESP cannot be the index of an indir.");
        if (baseOpnd == nullptr)
        {
            Assert(indexOpnd != nullptr);
            regIndex = this->GetRegEncode(indexOpnd);
            dispSize = 4;
            *(m_pc++) = ( Mod00 | reg1 | 0x4);
            *(m_pc++) = (((indirOpnd->GetScale() & 3) << 6) | ((regIndex & 7) << 3) | 0x5);

            rexEncoding |= this->GetRexByte(this->REXX, indexOpnd);
        }
        else
        {
            regBase = this->GetRegEncode(baseOpnd);

            if (indexOpnd != nullptr)
            {
                regIndex = this->GetRegEncode(indexOpnd);
                *(m_pc++) = (this->GetMod(indirOpnd, &dispSize) | reg1 | 0x4);
                *(m_pc++) = (((indirOpnd->GetScale() & 3) << 6) | ((regIndex & 7) << 3) | (regBase & 7));

                rexEncoding |= this->GetRexByte(this->REXX, indexOpnd);
                rexEncoding |= this->GetRexByte(this->REXB, baseOpnd);
            }
            else if (baseOpnd->GetReg() == RegR12 || baseOpnd->GetReg() == RegRSP)
            {
                //
                // Using RSP/R12 as base requires the SIB byte even where there is no index.
                //
                *(m_pc++) = (this->GetMod(indirOpnd, &dispSize) | reg1 | regBase);
                *(m_pc++) = (BYTE)(((regBase & 7) << 3) | (regBase & 7));

                rexEncoding |= this->GetRexByte(this->REXB, baseOpnd);
            }
            else
            {
                *(m_pc++) = (this->GetMod(indirOpnd, &dispSize) | reg1 | regBase);
                rexEncoding |= this->GetRexByte(this->REXB, baseOpnd);
            }
        }
        break;

    case IR::OpndKindMemRef:
        *(m_pc++)   = (char)(reg1 | 0x4);
        *(m_pc++)   = 0x25;       // SIB displacement
        AssertMsg(Math::FitsInDWord((size_t)opnd->AsMemRefOpnd()->GetMemLoc()), "Size overflow");
        dispSize    = 4;
        break;

    default:
        AssertMsg(UNREACHED, "Unexpected operand kind");
        break;
    }

    AssertMsg(dispSize != -1, "Uninitialized dispSize");

    BYTE retval = this->EmitImmed(opnd, dispSize, 0);

    AssertMsg(retval == 0, "Not possible.");
    return rexEncoding;
}